

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall
cmMakefile::ExpandArguments
          (cmMakefile *this,vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *inArgs,
          vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *outArgs)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  cmListFileContext *pcVar4;
  pointer __args;
  string *stringArg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_00;
  string_view arg;
  bool local_81;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stringArgs;
  
  value._M_dataplus._M_p =
       (pointer)(this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
  value._M_string_length =
       (size_type)
       (this->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value._M_string_length)->_M_use_count +
           1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value._M_string_length)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value._M_string_length)->_M_use_count +
           1;
    }
  }
  pcVar4 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                     ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&value);
  if (value._M_string_length != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)value._M_string_length);
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::reserve
            (outArgs,((long)(inArgs->
                            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inArgs->
                            super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
  __args = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar1 = (inArgs->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (__args != pcVar1) {
    do {
      if (__args->Delim == Bracket) {
        stringArgs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
        std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
        emplace_back<std::__cxx11::string_const&,bool>
                  ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                   outArgs,&__args->Value,(bool *)&stringArgs);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&value);
        ExpandVariablesInString
                  (this,&value,false,false,false,(pcVar4->FilePath)._M_dataplus._M_p,__args->Line,
                   false,false);
        if (__args->Delim == Quoted) {
          stringArgs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
          std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
          emplace_back<std::__cxx11::string&,bool>
                    ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>> *)
                     outArgs,&value,(bool *)&stringArgs);
        }
        else {
          arg._M_str = value._M_dataplus._M_p;
          arg._M_len = value._M_string_length;
          cmExpandedList_abi_cxx11_(&stringArgs,arg,false);
          pbVar2 = stringArgs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (__args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT71(stringArgs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    stringArgs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_);
              __args_00 != pbVar2; __args_00 = __args_00 + 1) {
            local_81 = false;
            std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>::
            emplace_back<std::__cxx11::string_const&,bool>
                      ((vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>
                        *)outArgs,__args_00,&local_81);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&stringArgs);
        }
      }
      __args = __args + 1;
    } while (__args != pcVar1);
  }
  bVar3 = true;
  if (cmSystemTools::s_FatalErrorOccurred == false) {
    bVar3 = cmSystemTools::GetInterruptFlag();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)value._M_dataplus._M_p != &value.field_2) {
    operator_delete(value._M_dataplus._M_p,
                    CONCAT71(value.field_2._M_allocated_capacity._1_7_,value.field_2._M_local_buf[0]
                            ) + 1);
  }
  return (bool)(bVar3 ^ 1);
}

Assistant:

bool cmMakefile::ExpandArguments(
  std::vector<cmListFileArgument> const& inArgs,
  std::vector<cmExpandedCommandArgument>& outArgs) const
{
  std::string const& filename = this->GetBacktrace().Top().FilePath;
  std::string value;
  outArgs.reserve(inArgs.size());
  for (cmListFileArgument const& i : inArgs) {
    // No expansion in a bracket argument.
    if (i.Delim == cmListFileArgument::Bracket) {
      outArgs.emplace_back(i.Value, true);
      continue;
    }
    // Expand the variables in the argument.
    value = i.Value;
    this->ExpandVariablesInString(value, false, false, false, filename.c_str(),
                                  i.Line, false, false);

    // If the argument is quoted, it should be one argument.
    // Otherwise, it may be a list of arguments.
    if (i.Delim == cmListFileArgument::Quoted) {
      outArgs.emplace_back(value, true);
    } else {
      std::vector<std::string> stringArgs = cmExpandedList(value);
      for (std::string const& stringArg : stringArgs) {
        outArgs.emplace_back(stringArg, false);
      }
    }
  }
  return !cmSystemTools::GetFatalErrorOccurred();
}